

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_misc.c
# Opt level: O0

void oscformat_set(t_oscformat *x,t_symbol *s,int argc,t_atom *argv)

{
  size_t sVar1;
  size_t sVar2;
  ulong newsize_00;
  char *pcVar3;
  char *local_438;
  char *where;
  size_t newsize;
  char local_418;
  char acStack_417 [3];
  int i;
  char buf [1000];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_oscformat *x_local;
  
  *x->x_pathbuf = '\0';
  local_418 = '/';
  for (newsize._4_4_ = 0; newsize._4_4_ < argc; newsize._4_4_ = newsize._4_4_ + 1) {
    if ((argv[newsize._4_4_].a_type == A_SYMBOL) &&
       (*(argv[newsize._4_4_].a_w.w_symbol)->s_name == '/')) {
      local_438 = &local_418;
    }
    else {
      local_438 = acStack_417;
    }
    atom_string(argv + newsize._4_4_,local_438,999);
    sVar1 = strlen(&local_418);
    sVar2 = strlen(x->x_pathbuf);
    newsize_00 = sVar1 + sVar2 + 1;
    if (x->x_pathsize < newsize_00) {
      pcVar3 = (char *)resizebytes(x->x_pathbuf,x->x_pathsize,newsize_00);
      x->x_pathbuf = pcVar3;
      x->x_pathsize = newsize_00;
    }
    strcat(x->x_pathbuf,&local_418);
  }
  return;
}

Assistant:

static void oscformat_set(t_oscformat *x, t_symbol *s, int argc, t_atom *argv)
{
    char buf[MAXPDSTRING];
    int i;
    size_t newsize;
    *x->x_pathbuf = 0;
    buf[0] = '/';
    for (i = 0; i < argc; i++)
    {
        char *where = (argv[i].a_type == A_SYMBOL &&
            *argv[i].a_w.w_symbol->s_name == '/' ? buf : buf+1);
        atom_string(&argv[i], where, MAXPDSTRING-1);
        if ((newsize = strlen(buf) + strlen(x->x_pathbuf) + 1) > x->x_pathsize)
        {
            x->x_pathbuf = resizebytes(x->x_pathbuf, x->x_pathsize, newsize);
            x->x_pathsize = newsize;
        }
        strcat(x->x_pathbuf, buf);
    }
}